

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void google::protobuf::PlanAllocationSize
               (RepeatedPtrField<google::protobuf::EnumDescriptorProto> *enums,
               size_t parent_scope_size,FlatAllocator *alloc)

{
  bool bVar1;
  int iVar2;
  reference this;
  long lVar3;
  RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *values;
  size_t local_58;
  EnumDescriptorProto *e;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *__range2;
  FlatAllocator *alloc_local;
  size_t parent_scope_size_local;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *enums_local;
  
  iVar2 = RepeatedPtrField<google::protobuf::EnumDescriptorProto>::size(enums);
  anon_unknown_24::
  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ::PlanArray<google::protobuf::EnumDescriptor>
            (&alloc->
              super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ,iVar2);
  __end2 = RepeatedPtrField<google::protobuf::EnumDescriptorProto>::begin(enums);
  e = (EnumDescriptorProto *)RepeatedPtrField<google::protobuf::EnumDescriptorProto>::end(enums);
  while (bVar1 = internal::operator!=(&__end2,(iterator *)&e), bVar1) {
    this = internal::RepeatedPtrIterator<const_google::protobuf::EnumDescriptorProto>::operator*
                     (&__end2);
    if (parent_scope_size == 0) {
      EnumDescriptorProto::name_abi_cxx11_(this);
      local_58 = std::__cxx11::string::size();
    }
    else {
      EnumDescriptorProto::name_abi_cxx11_(this);
      lVar3 = std::__cxx11::string::size();
      local_58 = parent_scope_size + 1 + lVar3;
    }
    anon_unknown_24::
    FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ::PlanEntityNames(&alloc->
                       super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                      ,local_58);
    bVar1 = EnumDescriptorProto::has_options(this);
    if (bVar1) {
      anon_unknown_24::
      FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ::PlanArray<google::protobuf::EnumOptions>
                (&alloc->
                  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                 ,1);
    }
    values = EnumDescriptorProto::value(this);
    PlanAllocationSize(values,alloc);
    iVar2 = EnumDescriptorProto::reserved_range_size(this);
    anon_unknown_24::
    FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ::PlanArray<google::protobuf::EnumDescriptor::ReservedRange>
              (&alloc->
                super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
               ,iVar2);
    iVar2 = EnumDescriptorProto::reserved_name_size(this);
    (anonymous_namespace)::
    FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
    ::PlanArray<std::__cxx11::string_const*>
              ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                *)alloc,iVar2);
    iVar2 = EnumDescriptorProto::reserved_name_size(this);
    (anonymous_namespace)::
    FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
    ::PlanArray<std::__cxx11::string>
              ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                *)alloc,iVar2);
    internal::RepeatedPtrIterator<const_google::protobuf::EnumDescriptorProto>::operator++(&__end2);
  }
  return;
}

Assistant:

static void PlanAllocationSize(
    const RepeatedPtrField<EnumDescriptorProto>& enums,
    size_t parent_scope_size, internal::FlatAllocator& alloc) {
  alloc.PlanArray<EnumDescriptor>(enums.size());
  for (const auto& e : enums) {
    alloc.PlanEntityNames(parent_scope_size
                              ? parent_scope_size + 1 + e.name().size()
                              : e.name().size());
    if (e.has_options()) alloc.PlanArray<EnumOptions>(1);
    PlanAllocationSize(e.value(), alloc);
    alloc.PlanArray<EnumDescriptor::ReservedRange>(e.reserved_range_size());
    alloc.PlanArray<const std::string*>(e.reserved_name_size());
    alloc.PlanArray<std::string>(e.reserved_name_size());
  }
}